

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

void __thiscall
google::
dense_hashtable<int,int,std::hash<int>,google::dense_hash_set<int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<int>>::Identity,google::dense_hash_set<int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<int>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<int>>
::
copy_or_move_from<google::dense_hashtable<int,int,std::hash<int>,google::dense_hash_set<int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<int>>::Identity,google::dense_hash_set<int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<int>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<int>>>
          (dense_hashtable<int,int,std::hash<int>,google::dense_hash_set<int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<int>>::Identity,google::dense_hash_set<int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<int>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<int>>
           *this,dense_hashtable<int,_int,_std::hash<int>,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
                 *ht,size_type min_buckets_wanted)

{
  int *piVar1;
  size_type sVar2;
  long lVar3;
  int *value;
  size_type new_num_buckets;
  int *piVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  
  new_num_buckets =
       sparsehash_internal::sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>::
       min_buckets((sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4> *)this,
                   ht->num_elements - ht->num_deleted,min_buckets_wanted);
  dense_hashtable<int,_int,_std::hash<int>,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
  ::clear_to_size((dense_hashtable<int,_int,_std::hash<int>,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
                   *)this,new_num_buckets);
  sVar2 = ht->num_buckets;
  piVar4 = ht->table;
  piVar1 = piVar4 + sVar2;
  if (sVar2 != 0) {
    lVar5 = sVar2 << 2;
    do {
      if (((ht->key_info).empty_key != *piVar4) &&
         (ht->num_deleted == 0 || (ht->key_info).delkey != *piVar4)) break;
      piVar4 = piVar4 + 1;
      lVar5 = lVar5 + -4;
    } while (lVar5 != 0);
  }
  if (piVar4 != piVar1) {
    lVar5 = *(long *)(this + 0x38);
    lVar3 = *(long *)(this + 0x48);
    do {
      uVar6 = lVar5 - 1U & (long)*piVar4;
      if (*(int *)(this + 0x24) != *(int *)(lVar3 + uVar6 * 4)) {
        lVar7 = 1;
        do {
          uVar6 = uVar6 + lVar7 & lVar5 - 1U;
          lVar7 = lVar7 + 1;
        } while (*(int *)(this + 0x24) != *(int *)(lVar3 + uVar6 * 4));
      }
      *(int *)(lVar3 + uVar6 * 4) = *piVar4;
      *(long *)(this + 0x30) = *(long *)(this + 0x30) + 1;
      piVar4 = piVar4 + 1;
      if (piVar4 != piVar1) {
        do {
          if (((ht->key_info).empty_key != *piVar4) &&
             (ht->num_deleted == 0 || (ht->key_info).delkey != *piVar4)) break;
          piVar4 = piVar4 + 1;
        } while (piVar4 != piVar1);
      }
    } while (piVar4 != piVar1);
  }
  *(int *)(this + 0x1c) = *(int *)(this + 0x1c) + 1;
  return;
}

Assistant:

void copy_or_move_from(Hashtable&& ht, size_type min_buckets_wanted) {
    clear_to_size(settings.min_buckets(ht.size(), min_buckets_wanted));

    // We use a normal iterator to get non-deleted bcks from ht
    // We could use insert() here, but since we know there are
    // no duplicates and no deleted items, we can be more efficient
    assert((bucket_count() & (bucket_count() - 1)) == 0);  // a power of two
    for (auto&& value : ht) {
      size_type num_probes = 0;  // how many times we've probed
      size_type bucknum;
      const size_type bucket_count_minus_one = bucket_count() - 1;
      for (bucknum = hash(get_key(value)) & bucket_count_minus_one;
           !test_empty(bucknum);  // not empty
           bucknum =
               (bucknum + JUMP_(key, num_probes)) & bucket_count_minus_one) {
        ++num_probes;
        assert(num_probes < bucket_count() &&
               "Hashtable is full: an error in key_equal<> or hash<>");
      }

      using will_move = std::is_rvalue_reference<Hashtable&&>;
      using value_t = typename std::conditional<will_move::value, value_type&&, const_reference>::type;

      set_value(&table[bucknum], std::forward<value_t>(value));
      num_elements++;
    }
    settings.inc_num_ht_copies();
  }